

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

bool __thiscall RoboClaw::ReadMinMaxMainVoltages(RoboClaw *this,uint16_t *min,uint16_t *max)

{
  uint32_t uVar1;
  bool valid;
  
  uVar1 = Read4(this,this->m_address,';',&valid);
  if (valid == true) {
    *min = (uint16_t)(uVar1 >> 0x10);
    *max = (uint16_t)uVar1;
  }
  return valid;
}

Assistant:

bool RoboClaw::ReadMinMaxMainVoltages( uint16_t &min,uint16_t &max)
{
    bool valid;
    uint32_t value = Read4( m_address, GETMINMAXMAINVOLTAGES,&valid);
    if(valid)
    {
        min = value>>16;
        max = value&0xFFFF;
    }
    return valid;
}